

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Application.cpp
# Opt level: O3

void __thiscall
Application::rejectOrder
          (Application *this,SenderCompID *sender,TargetCompID *target,ClOrdID *clOrdID,
          Symbol *symbol,Side *side,string *message)

{
  pointer pcVar1;
  string local_518;
  undefined1 local_4f8 [16];
  _Alloc_hider local_4e8;
  char local_4d8 [16];
  _Alloc_hider local_4c8;
  size_type local_4c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4b8;
  field_metrics local_4a8;
  undefined1 local_4a0 [16];
  _Alloc_hider local_490;
  char local_480 [16];
  _Alloc_hider local_470;
  size_type local_468;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_460;
  field_metrics local_450;
  SenderCompID senderCompID;
  TargetCompID targetCompID;
  FieldBase local_398;
  FieldBase local_340;
  FieldBase local_2e8;
  FieldBase local_290;
  FieldBase local_238;
  FieldBase local_1e0;
  ExecutionReport fixOrder;
  
  targetCompID.super_StringField.super_FieldBase._vptr_FieldBase =
       (_func_int **)&PTR__FieldBase_0014a4c0;
  targetCompID.super_StringField.super_FieldBase.m_tag = 0x38;
  targetCompID.super_StringField.super_FieldBase.m_string._M_dataplus._M_p =
       (pointer)&targetCompID.super_StringField.super_FieldBase.m_string.field_2;
  pcVar1 = (sender->super_StringField).super_FieldBase.m_string._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&targetCompID.super_StringField.super_FieldBase.m_string,pcVar1,
             pcVar1 + (sender->super_StringField).super_FieldBase.m_string._M_string_length);
  targetCompID.super_StringField.super_FieldBase.m_data._M_dataplus._M_p =
       (pointer)&targetCompID.super_StringField.super_FieldBase.m_data.field_2;
  targetCompID.super_StringField.super_FieldBase.m_data._M_string_length = 0;
  targetCompID.super_StringField.super_FieldBase.m_data.field_2._M_local_buf[0] = '\0';
  targetCompID.super_StringField.super_FieldBase.m_metrics.m_length = 0;
  targetCompID.super_StringField.super_FieldBase.m_metrics.m_checksum = 0;
  targetCompID.super_StringField.super_FieldBase._vptr_FieldBase =
       (_func_int **)&PTR__FieldBase_0014a550;
  senderCompID.super_StringField.super_FieldBase._vptr_FieldBase =
       (_func_int **)&PTR__FieldBase_0014a4c0;
  senderCompID.super_StringField.super_FieldBase.m_tag = 0x31;
  senderCompID.super_StringField.super_FieldBase.m_string._M_dataplus._M_p =
       (pointer)&senderCompID.super_StringField.super_FieldBase.m_string.field_2;
  pcVar1 = (target->super_StringField).super_FieldBase.m_string._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&senderCompID.super_StringField.super_FieldBase.m_string,pcVar1,
             pcVar1 + (target->super_StringField).super_FieldBase.m_string._M_string_length);
  senderCompID.super_StringField.super_FieldBase.m_data._M_dataplus._M_p =
       (pointer)&senderCompID.super_StringField.super_FieldBase.m_data.field_2;
  senderCompID.super_StringField.super_FieldBase.m_data._M_string_length = 0;
  senderCompID.super_StringField.super_FieldBase.m_data.field_2._M_local_buf[0] = '\0';
  senderCompID.super_StringField.super_FieldBase.m_metrics.m_length = 0;
  senderCompID.super_StringField.super_FieldBase.m_metrics.m_checksum = 0;
  senderCompID.super_StringField.super_FieldBase._vptr_FieldBase =
       (_func_int **)&PTR__FieldBase_0014a518;
  local_4f8._0_8_ = &PTR__FieldBase_0014a4c0;
  local_4f8._8_4_ = 0x25;
  local_4e8._M_p = local_4d8;
  pcVar1 = (clOrdID->super_StringField).super_FieldBase.m_string._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_4e8,pcVar1,
             pcVar1 + (clOrdID->super_StringField).super_FieldBase.m_string._M_string_length);
  local_4c0 = 0;
  local_4b8._M_local_buf[0] = '\0';
  local_4a8.m_length = 0;
  local_4a8.m_checksum = 0;
  local_4f8._0_8_ = &PTR__FieldBase_0014a9e8;
  local_4c8._M_p = (pointer)&local_4b8;
  IDGenerator::genExecutionID_abi_cxx11_(&local_518,(IDGenerator *)(this + 0x80));
  local_4a0._0_8_ = &PTR__FieldBase_0014a4c0;
  local_4a0._8_4_ = 0x11;
  local_490._M_p = local_480;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_490,local_518._M_dataplus._M_p,
             local_518._M_dataplus._M_p + local_518._M_string_length);
  local_470._M_p = (pointer)&local_460;
  local_468 = 0;
  local_460._M_local_buf[0] = '\0';
  local_450.m_length = 0;
  local_450.m_checksum = 0;
  local_4a0._0_8_ = &PTR__FieldBase_0014aa20;
  FIX::CharField::CharField((CharField *)&local_2e8,0x14,'0');
  local_2e8._vptr_FieldBase = (_func_int **)&PTR__FieldBase_0014aa58;
  FIX::CharField::CharField((CharField *)&local_340,0x96,'8');
  local_340._vptr_FieldBase = (_func_int **)&PTR__FieldBase_0014aa90;
  FIX::CharField::CharField((CharField *)&local_398,0x27,'8');
  local_398._vptr_FieldBase = (_func_int **)&PTR__FieldBase_0014aac8;
  FIX::DoubleField::DoubleField((DoubleField *)&local_1e0,0x97,0.0,0);
  local_1e0._vptr_FieldBase = (_func_int **)&PTR__FieldBase_0014ab00;
  FIX::DoubleField::DoubleField((DoubleField *)&local_238,0xe,0.0,0);
  local_238._vptr_FieldBase = (_func_int **)&PTR__FieldBase_0014ab38;
  FIX::DoubleField::DoubleField((DoubleField *)&local_290,6,0.0,0);
  local_290._vptr_FieldBase = (_func_int **)&PTR__FieldBase_0014ab70;
  FIX42::ExecutionReport::ExecutionReport
            (&fixOrder,(OrderID *)local_4f8,(ExecID *)local_4a0,(ExecTransType *)&local_2e8,
             (ExecType *)&local_340,(OrdStatus *)&local_398,symbol,side,(LeavesQty *)&local_1e0,
             (CumQty *)&local_238,(AvgPx *)&local_290);
  FIX::FieldBase::~FieldBase(&local_290);
  FIX::FieldBase::~FieldBase(&local_238);
  FIX::FieldBase::~FieldBase(&local_1e0);
  FIX::FieldBase::~FieldBase(&local_398);
  FIX::FieldBase::~FieldBase(&local_340);
  FIX::FieldBase::~FieldBase(&local_2e8);
  FIX::FieldBase::~FieldBase((FieldBase *)local_4a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_518._M_dataplus._M_p != &local_518.field_2) {
    operator_delete(local_518._M_dataplus._M_p,local_518.field_2._M_allocated_capacity + 1);
  }
  FIX::FieldBase::~FieldBase((FieldBase *)local_4f8);
  FIX::FieldMap::setField((FieldMap *)&fixOrder,(FieldBase *)clOrdID,true);
  local_4f8._0_8_ = &PTR__FieldBase_0014a4c0;
  local_4f8._8_4_ = 0x3a;
  local_4e8._M_p = local_4d8;
  pcVar1 = (message->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_4e8,pcVar1,pcVar1 + message->_M_string_length);
  local_4c0 = 0;
  local_4b8._M_local_buf[0] = '\0';
  local_4a8.m_length = 0;
  local_4a8.m_checksum = 0;
  local_4f8._0_8_ = &PTR__FieldBase_0014acc0;
  local_4c8._M_p = (pointer)&local_4b8;
  FIX::FieldMap::setField((FieldMap *)&fixOrder,(FieldBase *)local_4f8,true);
  FIX::FieldBase::~FieldBase((FieldBase *)local_4f8);
  local_4f8._0_8_ = (string *)&local_4e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_4f8,"");
  FIX::Session::sendToTarget((Message *)&fixOrder,&senderCompID,&targetCompID,(string *)local_4f8);
  if ((string *)local_4f8._0_8_ != (string *)&local_4e8) {
    operator_delete((void *)local_4f8._0_8_,(ulong)(local_4e8._M_p + 1));
  }
  FIX::Message::~Message((Message *)&fixOrder);
  FIX::FieldBase::~FieldBase((FieldBase *)&senderCompID);
  FIX::FieldBase::~FieldBase((FieldBase *)&targetCompID);
  return;
}

Assistant:

void Application::rejectOrder(
    const FIX::SenderCompID &sender,
    const FIX::TargetCompID &target,
    const FIX::ClOrdID &clOrdID,
    const FIX::Symbol &symbol,
    const FIX::Side &side,
    const std::string &message) {
  FIX::TargetCompID targetCompID(sender.getValue());
  FIX::SenderCompID senderCompID(target.getValue());

  FIX42::ExecutionReport fixOrder(
      FIX::OrderID(clOrdID.getValue()),
      FIX::ExecID(m_generator.genExecutionID()),
      FIX::ExecTransType(FIX::ExecTransType_NEW),
      FIX::ExecType(FIX::ExecType_REJECTED),
      FIX::OrdStatus(FIX::ExecType_REJECTED),
      symbol,
      side,
      FIX::LeavesQty(0),
      FIX::CumQty(0),
      FIX::AvgPx(0));

  fixOrder.set(clOrdID);
  fixOrder.set(FIX::Text(message));

  try {
    FIX::Session::sendToTarget(fixOrder, senderCompID, targetCompID);
  } catch (FIX::SessionNotFound &) {}
}